

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O2

void __thiscall
xe::TestGroup::TestGroup
          (TestGroup *this,TestGroup *parent,TestNodeType nodeType,char *name,char *description)

{
  _Rb_tree_header *p_Var1;
  
  TestNode::TestNode(&this->super_TestNode,parent,nodeType,name,description);
  (this->super_TestNode)._vptr_TestNode = (_func_int **)&PTR__TestGroup_00127cf0;
  (this->m_children).super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_children).super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_children).super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->m_childNames)._M_t._M_impl.super__Rb_tree_header;
  (this->m_childNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_childNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_childNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_childNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_childNames)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

TestGroup::TestGroup (TestGroup* parent, TestNodeType nodeType, const char* name, const char* description)
	: TestNode(parent, nodeType, name, description)
{
	DE_ASSERT(nodeType == TESTNODETYPE_GROUP || nodeType == TESTNODETYPE_ROOT);
	DE_ASSERT(!parent == (nodeType == TESTNODETYPE_ROOT));
}